

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O2

void __thiscall Process::~Process(Process *this)

{
  int iVar1;
  int *piVar2;
  long local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  std::mutex::lock(&this->mMutex);
  if ((this->mReturn == -2) && (this->mPid != -1)) {
    __assert_fail("mReturn != ReturnUnset || mPid == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Process.cpp"
                  ,0x10f,"Process::~Process()");
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mMutex);
  if (this->mStdIn[0] != -1) {
    EventLoop::eventLoop();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
    if (local_20 != 0) {
      handleInput(this,this->mStdIn[1]);
    }
  }
  closeStdIn(this,CloseForce);
  closeStdOut(this);
  closeStdErr(this);
  if (this->mSync[0] != -1) {
    do {
      iVar1 = close(this->mSync[0]);
      if (iVar1 != -1) break;
      piVar2 = __errno_location();
    } while (*piVar2 == 4);
  }
  if (this->mSync[1] != -1) {
    do {
      iVar1 = close(this->mSync[1]);
      if (iVar1 != -1) break;
      piVar2 = __errno_location();
    } while (*piVar2 == 4);
  }
  std::__cxx11::string::~string((string *)&this->mErrorString);
  std::__cxx11::string::~string((string *)&this->mChRoot);
  std::__cxx11::string::~string((string *)&this->mCwd);
  std::__cxx11::string::~string((string *)&this->mStdErrBuffer);
  std::__cxx11::string::~string((string *)&this->mStdOutBuffer);
  std::deque<String,_std::allocator<String>_>::~deque(&this->mStdInBuffer);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::function<void_(Process_*)>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::function<void_(Process_*)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::function<void_(Process_*)>_>_>_>
  ::~_Rb_tree(&(this->mFinished).connections._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::function<void_(Process_*)>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::function<void_(Process_*)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::function<void_(Process_*)>_>_>_>
  ::~_Rb_tree(&(this->mReadyReadStdErr).connections._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::function<void_(Process_*)>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::function<void_(Process_*)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::function<void_(Process_*)>_>_>_>
  ::~_Rb_tree(&(this->mReadyReadStdOut).connections._M_t);
  return;
}

Assistant:

Process::~Process()
{
    {
        std::lock_guard<std::mutex> lock(mMutex);
        assert(mReturn != ReturnUnset || mPid == -1);
    }

    if (mStdIn[0] != -1 && EventLoop::eventLoop()) {
        // try to finish off any pending writes
        handleInput(mStdIn[1]);
    }

    closeStdIn(CloseForce);
    closeStdOut();
    closeStdErr();

    int w;
    if (mSync[0] != -1)
        eintrwrap(w, ::close(mSync[0]));
    if (mSync[1] != -1)
        eintrwrap(w, ::close(mSync[1]));
}